

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testSeparateHeaderAndFooter(Test *this)

{
  byte bVar1;
  bool bVar2;
  QStandardItem *pQVar3;
  AutoTableElement *pAVar4;
  QAbstractItemModel *t1;
  QString local_190;
  QString local_178;
  QFlags<KDReports::HeaderLocation> local_15c;
  undefined8 local_158;
  Footer *footer;
  QAbstractItemModel *baseModel;
  QString local_130;
  QFlags<KDReports::HeaderLocation> local_114;
  undefined8 local_110;
  Header *header;
  QString local_100;
  QFile local_e8 [8];
  QFile footerFile;
  AutoTableElement local_d8 [8];
  AutoTableElement autoTable;
  QString local_b0;
  undefined1 local_91;
  QString local_90;
  QStandardItemModel local_78 [8];
  QStandardItemModel model;
  QFlags<QIODeviceBase::OpenModeFlag> local_64;
  QString local_60;
  QFile local_48 [8];
  QFile file;
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  QString::QString(&local_60,":/doc_header.xml");
  QFile::QFile(local_48,(QString *)&local_60);
  QString::~QString(&local_60);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_64,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_48);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x15c);
  if ((bVar1 & 1) != 0) {
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)local_28,(ErrorDetails *)local_48);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x15d);
    if ((bVar1 & 1) != 0) {
      QStandardItemModel::QStandardItemModel(local_78,(QObject *)0x0);
      pQVar3 = (QStandardItem *)operator_new(0x10);
      local_91 = 1;
      QString::QString(&local_90,"cell1");
      QStandardItem::QStandardItem(pQVar3,(QString *)&local_90);
      local_91 = 0;
      QStandardItemModel::setItem((int)local_78,0,(QStandardItem *)0x0);
      QString::~QString(&local_90);
      pQVar3 = (QStandardItem *)operator_new(0x10);
      QString::QString(&local_b0,"cell2");
      QStandardItem::QStandardItem(pQVar3,(QString *)&local_b0);
      QStandardItemModel::setItem((int)local_78,0,(QStandardItem *)0x1);
      QString::~QString(&local_b0);
      KDReports::AutoTableElement::AutoTableElement(local_d8,(QAbstractItemModel *)local_78);
      pAVar4 = (AutoTableElement *)KDReports::Report::mainTable();
      KDReports::MainTable::setAutoTableElement(pAVar4);
      QString::QString(&local_100,":/doc_footer.xml");
      QFile::QFile(local_e8,(QString *)&local_100);
      QString::~QString(&local_100);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&header + 4),ReadOnly);
      bVar1 = QFile::open((QFlags_conflict *)local_e8);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"footerFile.open(QIODevice::ReadOnly)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x166);
      if ((bVar1 & 1) != 0) {
        bVar1 = KDReports::Report::loadFromXML((QIODevice *)local_28,(ErrorDetails *)local_e8);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&footerFile)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x167);
        if ((bVar1 & 1) != 0) {
          QFlags<KDReports::HeaderLocation>::QFlags(&local_114,AllPages);
          local_110 = KDReports::Report::header((QFlags_conflict *)local_28);
          KDReports::Header::preparePaintingPage((int)local_110);
          KDReports::Header::doc();
          KDReports::TextDocument::contentDocument();
          QTextDocument::toPlainText();
          QString::QString((QString *)&baseModel,"Page 1 of 1");
          bVar2 = QTest::qCompare(&local_130,(QString *)&baseModel,
                                  "header.doc().contentDocument().toPlainText()",
                                  "QString(\"Page 1 of 1\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x16e);
          QString::~QString((QString *)&baseModel);
          QString::~QString(&local_130);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            footer = (Footer *)local_78;
            KDReports::Report::mainTable();
            KDReports::MainTable::autoTableElement();
            t1 = (QAbstractItemModel *)KDReports::AutoTableElement::tableModel();
            bVar2 = QTest::qCompare<QAbstractItemModel>
                              (t1,(QAbstractItemModel *)footer,
                               "report.mainTable()->autoTableElement()->tableModel()","baseModel",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x170);
            if (bVar2) {
              QFlags<KDReports::HeaderLocation>::QFlags(&local_15c,AllPages);
              local_158 = KDReports::Report::footer((QFlags_conflict *)local_28);
              KDReports::Header::doc();
              KDReports::TextDocument::contentDocument();
              QTextDocument::toPlainText();
              QString::QString(&local_190,"footer");
              QTest::qCompare(&local_178,&local_190,"footer.doc().contentDocument().toPlainText()",
                              "QString(\"footer\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x172);
              QString::~QString(&local_190);
              QString::~QString(&local_178);
            }
          }
        }
      }
      QFile::~QFile(local_e8);
      KDReports::AutoTableElement::~AutoTableElement(local_d8);
      QStandardItemModel::~QStandardItemModel(local_78);
    }
  }
  QFile::~QFile(local_48);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testSeparateHeaderAndFooter()
    {
        Report report;
        report.setReportMode(Report::SpreadSheet);

        QFile file(":/doc_header.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        AutoTableElement autoTable(&model);
        report.mainTable()->setAutoTableElement(autoTable);

        QFile footerFile(":/doc_footer.xml");
        QVERIFY(footerFile.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&footerFile));

        // report.exportToFile( "testSeparateHeaderAndFooter.pdf" ); // for debugging

        // Check that we have header, table, and footer
        Header &header = report.header();
        header.preparePaintingPage(0);
        QCOMPARE(header.doc().contentDocument().toPlainText(), QString("Page 1 of 1"));
        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        Footer &footer = report.footer();
        QCOMPARE(footer.doc().contentDocument().toPlainText(), QString("footer"));
    }